

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

int Abc_SclHasBufferFanout(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (iVar1 <= local_24) {
      return 0;
    }
    pObj_00 = Abc_ObjFanout(pObj,local_24);
    iVar1 = Abc_ObjIsBuffer(pObj_00);
    if (iVar1 != 0) break;
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

int Abc_SclHasBufferFanout( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            return 1;
    return 0;
}